

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

int evaluate_retry_action(RETRY_CONTROL_INSTANCE *retry_control,RETRY_ACTION *retry_action)

{
  LOGGER_LOG p_Var1;
  time_t stopTime;
  double dVar2;
  LOGGER_LOG l_1;
  time_t current_tick_seconds;
  LOGGER_LOG l;
  int result;
  RETRY_ACTION *retry_action_local;
  RETRY_CONTROL_INSTANCE *retry_control_local;
  
  if (retry_control->retry_count == 0) {
    *retry_action = RETRY_ACTION_RETRY_NOW;
    l._4_4_ = 0;
  }
  else if ((retry_control->last_retry_tick_seconds == -1) &&
          (retry_control->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"evaluate_retry_action",0x7e,1,
                "Failed to evaluate retry action (last_retry_tick_second is INDEFINITE_TIME)");
    }
    l._4_4_ = 0x7f;
  }
  else {
    stopTime = retry_get_tick_seconds(retry_control);
    if (stopTime == -1) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                  ,"evaluate_retry_action",0x87,1,
                  "Failed to evaluate retry action (retry_get_tick_seconds() failed)");
      }
      l._4_4_ = 0x88;
    }
    else {
      if ((retry_control->max_retry_time_in_secs == 0) ||
         (dVar2 = get_difftime(stopTime,retry_control->first_retry_tick_seconds),
         dVar2 < (double)retry_control->max_retry_time_in_secs)) {
        if (retry_control->policy == IOTHUB_CLIENT_RETRY_IMMEDIATE) {
          *retry_action = RETRY_ACTION_RETRY_NOW;
        }
        else {
          dVar2 = get_difftime(stopTime,retry_control->last_retry_tick_seconds);
          if ((double)retry_control->current_wait_time_in_secs <= dVar2) {
            *retry_action = RETRY_ACTION_RETRY_NOW;
          }
          else {
            *retry_action = RETRY_ACTION_RETRY_LATER;
          }
        }
      }
      else {
        *retry_action = RETRY_ACTION_STOP_RETRYING;
      }
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

static int evaluate_retry_action(RETRY_CONTROL_INSTANCE* retry_control, RETRY_ACTION* retry_action)
{
    int result;

    if (retry_control->retry_count == 0)
    {
        *retry_action = RETRY_ACTION_RETRY_NOW;
        result = RESULT_OK;
    }
    else if (retry_control->last_retry_tick_seconds == INDEFINITE_TIME &&
             retry_control->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)
    {
        LogError("Failed to evaluate retry action (last_retry_tick_second is INDEFINITE_TIME)");
        result = MU_FAILURE;
    }
    else
    {
        time_t current_tick_seconds;

        if ((current_tick_seconds = retry_get_tick_seconds(retry_control)) == INDEFINITE_TIME)
        {
            LogError("Failed to evaluate retry action (retry_get_tick_seconds() failed)");
            result = MU_FAILURE;
        }
        else if (retry_control->max_retry_time_in_secs > 0 &&
            get_difftime(current_tick_seconds, retry_control->first_retry_tick_seconds) >= retry_control->max_retry_time_in_secs)
        {
            *retry_action = RETRY_ACTION_STOP_RETRYING;

            result = RESULT_OK;
        }
        else if (retry_control->policy == IOTHUB_CLIENT_RETRY_IMMEDIATE)
        {
            *retry_action = RETRY_ACTION_RETRY_NOW;

            result = RESULT_OK;
        }
        else if (get_difftime(current_tick_seconds, retry_control->last_retry_tick_seconds) < retry_control->current_wait_time_in_secs)
        {
            *retry_action = RETRY_ACTION_RETRY_LATER;

            result = RESULT_OK;
        }
        else
        {
            *retry_action = RETRY_ACTION_RETRY_NOW;

            result = RESULT_OK;
        }
    }

    return result;
}